

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  buffer<char> *this;
  size_t sVar5;
  char cVar6;
  uint uVar7;
  result rVar8;
  long lVar9;
  decimal_fp<float> dVar10;
  byte bVar11;
  uint uVar12;
  size_t count;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint64_t error;
  size_t __len;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  fp fVar19;
  fp fVar20;
  decimal_fp<double> dVar21;
  ulong uStackY_a0;
  int local_88;
  int cached_exp10;
  uint64_t local_80;
  float local_74;
  buffer<char> *local_70;
  fixed_handler handler;
  
  uVar13 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar13 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_88 = 0;
    }
    else {
      buffer<char>::try_resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_88 = -precision;
    }
  }
  else {
    uVar7 = specs._4_4_;
    if ((uVar7 >> 0x13 & 1) == 0) {
      local_88 = snprintf_float<long_double>(value,precision,specs,buf);
    }
    else if (precision < 0) {
      if ((uVar7 >> 0x12 & 1) == 0) {
        dVar21 = dragonbox::to_decimal<double>((double)value);
        write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar21.significand);
        local_88 = dVar21.exponent;
      }
      else {
        local_74 = (float)value;
        dVar10 = dragonbox::to_decimal<float>(local_74);
        write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar10.significand);
        local_88 = dVar10.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = buf;
      local_70 = buf;
      fVar19 = normalize<0>((detail *)0x0,(fp)(auVar4 << 0x40));
      fVar20 = get_cached_power(-0x7c - fVar19.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar20.f;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = fVar19.f;
      uVar16 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
      iVar15 = fVar20.e + fVar19.e;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      handler.buf = local_70->ptr_;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      local_80 = CONCAT44(local_80._4_4_,iVar15);
      bVar11 = -(char)iVar15;
      uVar17 = 1L << (bVar11 & 0x3f);
      uVar14 = uVar16 >> (bVar11 & 0x3f);
      uVar12 = (uint)uVar14 | 1;
      uVar1 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      lVar9 = (uVar14 & 0xffffffff) + *(long *)(count_digits_inc(int)::table + (ulong)uVar1 * 8);
      local_88 = (int)((ulong)lVar9 >> 0x20);
      handler.fixed = uVar13 == 0x200000000;
      rVar8 = fixed_handler::on_start
                        (&handler,*(long *)(power_of_10_64(int)::data +
                                           (lVar9 + -0x100000000 >> 0x20) * 8) << (bVar11 & 0x3f),
                         uVar16 / 10,10,&local_88);
      if (rVar8 == more) {
        bVar11 = -(char)local_80 - 0x40;
        uVar18 = uVar17 - 1;
        uVar16 = uVar16 & uVar18;
        error = 1;
        local_80 = uVar17;
        do {
          iVar15 = local_88 + -1;
          switch(iVar15) {
          case 0:
            cVar6 = (char)uVar14;
            uVar14 = 0;
            goto LAB_00137056;
          case 1:
            uStackY_a0 = 10;
            break;
          case 2:
            uStackY_a0 = 100;
            break;
          case 3:
            uStackY_a0 = 1000;
            break;
          case 4:
            uStackY_a0 = 10000;
            break;
          case 5:
            uStackY_a0 = 100000;
            break;
          case 6:
            uStackY_a0 = 1000000;
            break;
          case 7:
            uStackY_a0 = 10000000;
            break;
          case 8:
            uStackY_a0 = 100000000;
            break;
          case 9:
            uStackY_a0 = 1000000000;
            break;
          default:
            cVar6 = '\0';
            goto LAB_00137056;
          }
          cVar6 = (char)((uVar14 & 0xffffffff) / uStackY_a0);
          uVar14 = (uVar14 & 0xffffffff) % uStackY_a0;
LAB_00137056:
          lVar9 = (long)local_88;
          local_88 = iVar15;
          rVar8 = fixed_handler::on_digit
                            (&handler,cVar6 + '0',
                             *(long *)(dragonbox::divisible_by_power_of_5(unsigned_long,int)::
                                       divtest_table + lVar9 * 8 + 0x178) << (bVar11 & 0x3f),
                             ((uVar14 & 0xffffffff) << (bVar11 & 0x3f)) + uVar16,1,iVar15,true);
          uVar17 = local_80;
          if (rVar8 != more) goto LAB_001370f4;
        } while (0 < local_88);
        do {
          uVar14 = uVar16 * 10;
          error = error * 10;
          uVar16 = uVar14 & uVar18;
          local_88 = local_88 + -1;
          rVar8 = fixed_handler::on_digit
                            (&handler,(char)(uVar14 >> (bVar11 & 0x3f)) + '0',uVar17,uVar16,error,
                             local_88,false);
        } while (rVar8 == more);
      }
LAB_001370f4:
      this = local_70;
      if (rVar8 == error) {
        local_88 = local_88 + ~cached_exp10 + handler.size;
        fallback_format<long_double>
                  (value,handler.precision,(bool)((byte)((ulong)specs >> 0x32) & 1),local_70,
                   &local_88);
      }
      else {
        local_88 = local_88 + handler.exp10;
        buffer<char>::try_resize(local_70,(ulong)(uint)handler.size);
      }
      if ((uVar7 >> 0x14 & 1) == 0 && uVar13 != 0x200000000) {
        sVar5 = this->size_;
        iVar15 = local_88;
        do {
          local_88 = iVar15;
          count = sVar5;
          if (count == 0) break;
          sVar5 = count - 1;
          iVar15 = local_88 + 1;
        } while (this->ptr_[count - 1] == '0');
        buffer<char>::try_resize(this,count);
      }
    }
  }
  return local_88;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}